

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall wasm::Wasm2JSBuilder::getImportName(Wasm2JSBuilder *this,Importable *imp)

{
  ValueBuilder *this_00;
  char *pcVar1;
  bool bVar2;
  Ref RVar3;
  Ref RVar4;
  char *in_RDX;
  char *extraout_RDX;
  void *pvVar5;
  Name name;
  IString str;
  string_view sVar6;
  
  name.super_IString.str._M_str = in_RDX;
  name.super_IString.str._M_len = (size_t)(imp->base).super_IString.str._M_str;
  bVar2 = needsQuoting((wasm *)(imp->base).super_IString.str._M_len,name);
  sVar6 = (string_view)fromName(this,(Name)(imp->module).super_IString.str,Top);
  pvVar5 = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,pvVar5);
  (RVar3.inst)->type = String;
  ((RVar3.inst)->field_1).str.str = sVar6;
  this_00 = (ValueBuilder *)(imp->base).super_IString.str._M_len;
  pcVar1 = (imp->base).super_IString.str._M_str;
  if (bVar2) {
    str.str._M_str = extraout_RDX;
    str.str._M_len = (size_t)pcVar1;
    RVar4 = cashew::ValueBuilder::makeString(this_00,str);
    RVar3 = cashew::ValueBuilder::makeSub(RVar3,RVar4);
    return (Ref)RVar3.inst;
  }
  pvVar5 = (void *)0x18;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar4.inst)->type = Null;
  cashew::Value::free(RVar4.inst,pvVar5);
  (RVar4.inst)->type = String;
  ((RVar4.inst)->field_1).arr = (ArrayStorage *)this_00;
  ((RVar4.inst)->field_1).str.str._M_str = pcVar1;
  RVar3 = cashew::ValueBuilder::makeDot(RVar3,RVar4);
  return (Ref)RVar3.inst;
}

Assistant:

Ref Wasm2JSBuilder::getImportName(const Importable& imp) {
  if (needsQuoting(imp.base)) {
    return ValueBuilder::makeSub(
      ValueBuilder::makeName(fromName(imp.module, NameScope::Top)),
      ValueBuilder::makeString(imp.base));
  } else {
    return ValueBuilder::makeDot(
      ValueBuilder::makeName(fromName(imp.module, NameScope::Top)),
      ValueBuilder::makeName(imp.base));
  }
}